

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

string * __thiscall
netlist::VariableRangeSelect::toString_abi_cxx11_
          (string *__return_storage_ptr__,VariableRangeSelect *this)

{
  RangeSelectionKind RVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string local_78;
  string right;
  string left;
  
  left._M_dataplus._M_p = (pointer)&left.field_2;
  left._M_string_length = 0;
  left.field_2._M_local_buf[0] = '\0';
  if (*(__index_type *)
       ((long)&(this->leftIndex).value.
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) == '\0') {
    slang::syntax::SyntaxNode::toString_abi_cxx11_
              (&local_78,&this->expr->left_->syntax->super_SyntaxNode);
  }
  else {
    slang::ConstantValue::toString_abi_cxx11_(&local_78,&this->leftIndex,0x80,false,false);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&left,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  right._M_dataplus._M_p = (pointer)&right.field_2;
  right._M_string_length = 0;
  right.field_2._M_local_buf[0] = '\0';
  if (*(__index_type *)
       ((long)&(this->rightIndex).value.
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) == '\0') {
    slang::syntax::SyntaxNode::toString_abi_cxx11_
              (&local_78,&this->expr->right_->syntax->super_SyntaxNode);
  }
  else {
    slang::ConstantValue::toString_abi_cxx11_(&local_78,&this->rightIndex,0x80,false,false);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&right,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  RVar1 = this->expr->selectionKind;
  if (RVar1 == IndexedDown) {
    local_78._M_dataplus._M_p = left._M_dataplus._M_p;
    local_78._M_string_length = left._M_string_length;
    local_78.field_2._M_allocated_capacity = (size_type)right._M_dataplus._M_p;
    local_78.field_2._8_8_ = right._M_string_length;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_78;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x8;
    ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)"[{}-:{}]",fmt_00,args_00);
  }
  else if (RVar1 == IndexedUp) {
    local_78._M_dataplus._M_p = left._M_dataplus._M_p;
    local_78._M_string_length = left._M_string_length;
    local_78.field_2._M_allocated_capacity = (size_type)right._M_dataplus._M_p;
    local_78.field_2._8_8_ = right._M_string_length;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_78;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x8;
    ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)"[{}+:{}]",fmt,args);
  }
  else {
    local_78._M_dataplus._M_p = left._M_dataplus._M_p;
    local_78._M_string_length = left._M_string_length;
    local_78.field_2._M_allocated_capacity = (size_type)right._M_dataplus._M_p;
    local_78.field_2._8_8_ = right._M_string_length;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_78;
    fmt_01.size_ = 0xdd;
    fmt_01.data_ = (char *)0x7;
    ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x438a7a,fmt_01,args_01);
  }
  std::__cxx11::string::~string((string *)&right);
  std::__cxx11::string::~string((string *)&left);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const override {
        std::string left;
        if (leftIndexIsConstant()) {
            left = leftIndex.toString();
        }
        else {
            left = expr.left().syntax->toString();
        }
        std::string right;
        if (rightIndexIsConstant()) {
            right = rightIndex.toString();
        }
        else {
            right = expr.right().syntax->toString();
        }
        switch (expr.getSelectionKind()) {
            case ast::RangeSelectionKind::Simple:
                return fmt::format("[{}:{}]", left, right);
            case ast::RangeSelectionKind::IndexedUp:
                return fmt::format("[{}+:{}]", left, right);
            case ast::RangeSelectionKind::IndexedDown:
                return fmt::format("[{}-:{}]", left, right);
            default:
                SLANG_UNREACHABLE;
        }
    }